

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int encode_string_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,char *value,
                       size_t length,_Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  undefined7 in_register_00000081;
  char *pcVar4;
  uchar local_25;
  uchar local_24;
  uchar local_23;
  uchar local_22;
  uchar local_21;
  
  if ((int)CONCAT71(in_register_00000081,use_smallest) == 0) {
    iVar1 = (*encoder_output)(context,&local_23,1);
    if ((((iVar1 == 0) && (iVar1 = (*encoder_output)(context,&local_22,1), iVar1 == 0)) &&
        (iVar1 = (*encoder_output)(context,&local_25,1), iVar1 == 0)) &&
       ((iVar1 = (*encoder_output)(context,&local_21,1), iVar1 == 0 &&
        (iVar1 = (*encoder_output)(context,(uchar *)value,length), iVar1 == 0)))) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xdeb;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xdeb;
    }
    pcVar4 = "Failed encoding large string value";
    iVar3 = 0xdea;
  }
  else {
    iVar1 = (*encoder_output)(context,&local_24,1);
    if ((iVar1 == 0) && (iVar1 = (*encoder_output)(context,(uchar *)value,length), iVar1 == 0)) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xdd8;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xdd8;
    }
    pcVar4 = "Failed encoding small string value";
    iVar3 = 0xdd7;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"encode_string_value",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int encode_string_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, const char* value, size_t length, bool use_smallest)
{
    int result;

    if (use_smallest)
    {
        /* Codes_SRS_AMQPVALUE_01_299: [<encoding name="str8-utf8" code="0xa1" category="variable" width="1" label="up to 2^8 - 1 octets worth of UTF-8 Unicode (with no byte order mark)"/>] */
        if ((output_byte(encoder_output, context, (unsigned char)length) != 0) ||
            (output_bytes(encoder_output, context, value, length) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding small string value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_300: [<encoding name="str32-utf8" code="0xb1" category="variable" width="4" label="up to 2^32 - 1 octets worth of UTF-8 Unicode (with no byte order mark)"/>] */
        if ((output_byte(encoder_output, context, (length >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (length >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (length >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, length & 0xFF) != 0) ||
            (output_bytes(encoder_output, context, value, length) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding large string value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;

}